

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O3

void NthElement(long N,long *StartSeed)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  long lVar6;
  
  if ((0 < verbose) &&
     (iVar1 = NthElement::ln + 1, uVar4 = NthElement::ln * 0x26e978d5 + 0x27ef9dad,
     NthElement::ln = iVar1, (uVar4 >> 3 | uVar4 * 0x20000000) < 0x418937)) {
    NthElement_cold_1();
  }
  lVar5 = *StartSeed;
  if (0 < N) {
    lVar6 = 0x41a7;
    do {
      if ((N & 1U) != 0) {
        lVar5 = (lVar5 * lVar6) % 0x7fffffff;
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = lVar6 * lVar6;
      lVar6 = lVar6 * lVar6 + (SUB168(auVar3 * ZEXT816(0x8000000100000003),8) >> 0x1e) * -0x7fffffff
      ;
      bVar2 = 1 < (ulong)N;
      N = (ulong)N >> 1;
    } while (bVar2);
  }
  *StartSeed = lVar5;
  return;
}

Assistant:

void NthElement (DSS_HUGE N, DSS_HUGE *StartSeed)
   {
   DSS_HUGE Z;
   DSS_HUGE Mult;
   static int ln=-1;
   int i;

   if ((verbose > 0) && ++ln % 1000 == 0)
       {
       i = ln % LN_CNT;
       fprintf(stderr, "%c\b", lnoise[i]);
       }
   Mult = Multiplier;
   Z = (DSS_HUGE) *StartSeed;
   while (N > 0 )
      {
      if (N % 2 != 0)    /* testing for oddness, this seems portable */
         Z = (Mult * Z) % Modulus;
      N = N / 2;         /* integer division, truncates */
      Mult = (Mult * Mult) % Modulus;
      }
   *StartSeed = Z;

   return;
   }